

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap_stl.hpp
# Opt level: O2

void chaiscript::bootstrap::standard_library::detail::
     input_range_type_impl<chaiscript::bootstrap::standard_library::Bidir_Range<std::vector<unsigned_short,std::allocator<unsigned_short>>const,__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>>
               (string *type,Module *m)

{
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  allocator<char> local_179;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_158;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_148;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_138;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_128;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_118;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,type,"_Range");
  local_178._M_dataplus._M_p =
       (pointer)&Bidir_Range<std::vector<unsigned_short,std::allocator<unsigned_short>>const,__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>
                 ::typeinfo;
  local_178._M_string_length =
       (size_type)
       &Bidir_Range<std::vector<unsigned_short,std::allocator<unsigned_short>>const,__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>
        ::typeinfo;
  local_178.field_2._M_allocated_capacity._0_4_ = 0;
  std::
  vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
  ::emplace_back<chaiscript::Type_Info&,std::__cxx11::string>
            ((vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
              *)m,(Type_Info *)&local_178,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::operator+(&local_178,type,"_Range");
  copy_constructor<chaiscript::bootstrap::standard_library::Bidir_Range<std::vector<unsigned_short,std::allocator<unsigned_short>>const,__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>>
            (&local_178,m);
  std::__cxx11::string::~string((string *)&local_178);
  constructor<chaiscript::bootstrap::standard_library::Bidir_Range<std::vector<unsigned_short,std::allocator<unsigned_short>>const,__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>(std::vector<unsigned_short,std::allocator<unsigned_short>>const&)>
            ();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"range_internal",(allocator<char> *)&local_178);
  this = &m->m_funcs;
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_108,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_108.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_178._M_dataplus._M_p =
       (pointer)Bidir_Range<const_std::vector<unsigned_short,_std::allocator<unsigned_short>_>,___gnu_cxx::__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                ::empty;
  local_178._M_string_length = 0;
  dispatch::detail::
  make_callable_impl<bool(chaiscript::bootstrap::standard_library::Bidir_Range<std::vector<unsigned_short,std::allocator<unsigned_short>>const,__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>::*)()noexcept_const,true,true,false,false,bool,chaiscript::bootstrap::standard_library::Bidir_Range<std::vector<unsigned_short,std::allocator<unsigned_short>>const,__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>const&>
            (&local_118);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"empty",&local_179);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_118,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_118.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_178._M_dataplus._M_p =
       (pointer)Bidir_Range<const_std::vector<unsigned_short,_std::allocator<unsigned_short>_>,___gnu_cxx::__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                ::pop_front;
  local_178._M_string_length = 0;
  dispatch::detail::
  make_callable_impl<void(chaiscript::bootstrap::standard_library::Bidir_Range<std::vector<unsigned_short,std::allocator<unsigned_short>>const,__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>::*)(),false,true,false,false,void,chaiscript::bootstrap::standard_library::Bidir_Range<std::vector<unsigned_short,std::allocator<unsigned_short>>const,__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>&>
            (&local_128);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"pop_front",&local_179);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_128,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_128.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_178._M_dataplus._M_p =
       (pointer)Bidir_Range<const_std::vector<unsigned_short,_std::allocator<unsigned_short>_>,___gnu_cxx::__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                ::front;
  local_178._M_string_length = 0;
  dispatch::detail::
  make_callable_impl<unsigned_short_const&(chaiscript::bootstrap::standard_library::Bidir_Range<std::vector<unsigned_short,std::allocator<unsigned_short>>const,__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>::*)()const,false,true,false,false,unsigned_short_const&,chaiscript::bootstrap::standard_library::Bidir_Range<std::vector<unsigned_short,std::allocator<unsigned_short>>const,__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>const&>
            (&local_138);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"front",&local_179);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_138,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_138.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_178._M_dataplus._M_p =
       (pointer)Bidir_Range<const_std::vector<unsigned_short,_std::allocator<unsigned_short>_>,___gnu_cxx::__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                ::pop_back;
  local_178._M_string_length = 0;
  dispatch::detail::
  make_callable_impl<void(chaiscript::bootstrap::standard_library::Bidir_Range<std::vector<unsigned_short,std::allocator<unsigned_short>>const,__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>::*)(),false,true,false,false,void,chaiscript::bootstrap::standard_library::Bidir_Range<std::vector<unsigned_short,std::allocator<unsigned_short>>const,__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>&>
            (&local_148);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"pop_back",&local_179);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_148,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_148.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_178._M_dataplus._M_p =
       (pointer)Bidir_Range<const_std::vector<unsigned_short,_std::allocator<unsigned_short>_>,___gnu_cxx::__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                ::back;
  local_178._M_string_length = 0;
  dispatch::detail::
  make_callable_impl<unsigned_short_const&(chaiscript::bootstrap::standard_library::Bidir_Range<std::vector<unsigned_short,std::allocator<unsigned_short>>const,__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>::*)()const,false,true,false,false,unsigned_short_const&,chaiscript::bootstrap::standard_library::Bidir_Range<std::vector<unsigned_short,std::allocator<unsigned_short>>const,__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>const&>
            (&local_158);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"back",&local_179);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_158,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_158.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void input_range_type_impl(const std::string &type, Module &m) {
      m.add(user_type<Bidir_Type>(), type + "_Range");

      copy_constructor<Bidir_Type>(type + "_Range", m);

      m.add(constructor<Bidir_Type(typename Bidir_Type::container_type &)>(), "range_internal");

      m.add(fun(&Bidir_Type::empty), "empty");
      m.add(fun(&Bidir_Type::pop_front), "pop_front");
      m.add(fun(&Bidir_Type::front), "front");
      m.add(fun(&Bidir_Type::pop_back), "pop_back");
      m.add(fun(&Bidir_Type::back), "back");
    }